

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_encode_decode.hpp
# Opt level: O3

string * code_utils::url_encode(string *__return_storage_ptr__,string *value)

{
  byte __c;
  size_type sVar1;
  pointer pcVar2;
  string *extraout_RAX;
  string *extraout_RAX_00;
  string *psVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  string *extraout_RAX_01;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  size_type sVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  size_type *local_70;
  size_type local_68;
  size_type local_60;
  undefined8 uStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
            (__return_storage_ptr__,value->_M_string_length);
  sVar1 = value->_M_string_length;
  psVar3 = extraout_RAX;
  if (sVar1 != 0) {
    pcVar2 = (value->_M_dataplus)._M_p;
    sVar6 = 0;
    do {
      __c = pcVar2[sVar6];
      if (((((byte)(__c - 0x30) < 10) || ((byte)((__c & 0xdf) + 0xbf) < 0x1a)) || (__c - 0x2d < 2))
         || ((__c == 0x5f || (__c == 0x7e)))) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (__return_storage_ptr__,__c);
        psVar3 = extraout_RAX_00;
      }
      else {
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"%","");
        pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 _M_replace_aux(&local_50,local_50._M_string_length,0,1,
                                "0123456789ABCDEF"[(byte)pcVar2[sVar6] >> 4]);
        local_90._M_dataplus._M_p = (pbVar4->_M_dataplus)._M_p;
        paVar5 = &pbVar4->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p == paVar5) {
          local_90.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
          local_90.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
          local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        }
        else {
          local_90.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
        }
        local_90._M_string_length = pbVar4->_M_string_length;
        (pbVar4->_M_dataplus)._M_p = (pointer)paVar5;
        pbVar4->_M_string_length = 0;
        (pbVar4->field_2)._M_local_buf[0] = '\0';
        pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 _M_replace_aux(&local_90,local_90._M_string_length,0,1,
                                "0123456789ABCDEF"[(byte)pcVar2[sVar6] & 0xf]);
        local_70 = (size_type *)(pbVar4->_M_dataplus)._M_p;
        paVar5 = &pbVar4->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70 == paVar5) {
          local_60 = paVar5->_M_allocated_capacity;
          uStack_58 = *(undefined8 *)((long)&pbVar4->field_2 + 8);
          local_70 = &local_60;
        }
        else {
          local_60 = paVar5->_M_allocated_capacity;
        }
        local_68 = pbVar4->_M_string_length;
        (pbVar4->_M_dataplus)._M_p = (pointer)paVar5;
        pbVar4->_M_string_length = 0;
        (pbVar4->field_2)._M_local_buf[0] = '\0';
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                  (__return_storage_ptr__,(char *)local_70,local_68);
        if (local_70 != &local_60) {
          operator_delete(local_70,local_60 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
        psVar3 = (string *)&local_50.field_2;
        if ((string *)local_50._M_dataplus._M_p != psVar3) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          psVar3 = extraout_RAX_01;
        }
      }
      sVar6 = sVar6 + 1;
    } while (sVar1 != sVar6);
  }
  return psVar3;
}

Assistant:

inline static std::string url_encode(const std::string &value) noexcept {
  static auto hex_chars = "0123456789ABCDEF";

  std::string result;
  result.reserve(value.size());  // Minimum size of result

  for (auto &chr : value) {
    if (!((chr >= '0' && chr <= '9') || (chr >= 'A' && chr <= 'Z') ||
          (chr >= 'a' && chr <= 'z') || chr == '-' || chr == '.' ||
          chr == '_' || chr == '~'))
      result += std::string("%") +
                hex_chars[static_cast<unsigned char>(chr) >> 4] +
                hex_chars[static_cast<unsigned char>(chr) & 15];
    else
      result += chr;
  }

  return result;
}